

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::PathExists(string *path)

{
  char *__file;
  uint uVar1;
  int iVar2;
  undefined1 local_a8 [8];
  stat st;
  string *path_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __file = (char *)std::__cxx11::string::c_str();
    iVar2 = lstat(__file,(stat *)local_a8);
    path_local._7_1_ = iVar2 == 0;
  }
  else {
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool SystemTools::PathExists(const std::string& path)
{
  if (path.empty()) {
    return false;
  }
#if defined(__CYGWIN__)
  // Convert path to native windows path if possible.
  char winpath[MAX_PATH];
  if (SystemTools::PathCygwinToWin32(path.c_str(), winpath)) {
    return (GetFileAttributesA(winpath) != INVALID_FILE_ATTRIBUTES);
  }
  struct stat st;
  return lstat(path.c_str(), &st) == 0;
#elif defined(_WIN32)
  return (GetFileAttributesW(Encoding::ToWindowsExtendedPath(path).c_str()) !=
          INVALID_FILE_ATTRIBUTES);
#else
  struct stat st;
  return lstat(path.c_str(), &st) == 0;
#endif
}